

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O2

ggml_tensor * __thiscall
test_cross_entropy_loss_back::build_graph(test_cross_entropy_loss_back *this,ggml_context *ctx)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  ggml_tensor *pgVar3;
  undefined8 uVar4;
  
  pgVar1 = test_case::ggml_new_tensor_1d(&this->super_test_case,ctx,GGML_TYPE_F32,1);
  ggml_set_name(pgVar1,"grad");
  pgVar2 = test_case::ggml_new_tensor(&this->super_test_case,ctx,this->type,4,(this->ne)._M_elems);
  ggml_set_name(pgVar2,"logits");
  pgVar3 = test_case::ggml_new_tensor(&this->super_test_case,ctx,this->type,4,(this->ne)._M_elems);
  ggml_set_name(pgVar3,"labels");
  uVar4 = ggml_soft_max(ctx,pgVar3);
  ggml_set_name(uVar4,"labels_normalized");
  pgVar1 = (ggml_tensor *)ggml_cross_entropy_loss_back(ctx,pgVar1,pgVar2,uVar4);
  ggml_set_name(pgVar1,"out");
  return pgVar1;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * grad = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, 1);
        ggml_set_name(grad, "grad");

        ggml_tensor * logits = ggml_new_tensor(ctx, type, 4, ne.data());
        ggml_set_name(logits, "logits");

        ggml_tensor * labels = ggml_new_tensor(ctx, type, 4, ne.data());
        ggml_set_name(labels, "labels");

        // Ensure labels add up to 1:
        labels = ggml_soft_max(ctx, labels);
        ggml_set_name(labels, "labels_normalized");

        ggml_tensor * out = ggml_cross_entropy_loss_back(ctx, grad, logits, labels);
        ggml_set_name(out, "out");

        return out;
    }